

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O1

string * Disassembler::procObj(string *__return_storage_ptr__,string *hex,int line)

{
  pointer pcVar1;
  int iVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string bin;
  string aux;
  char *local_188;
  size_type local_180;
  char local_178;
  undefined7 uStack_177;
  undefined8 uStack_170;
  string local_168;
  string local_148;
  undefined1 *local_128;
  long local_120;
  undefined1 local_118 [16];
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar1 = (hex->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + hex->_M_string_length);
  Conversion::hexToBin(&local_168,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__cxx11::string::substr((ulong)&local_128,(ulong)&local_168);
  local_180 = 0;
  local_178 = '\0';
  local_188 = &local_178;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_128,local_128 + local_120);
  iVar2 = AsmFuncts::getType(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (iVar2 == 2) {
    paVar4 = &local_88.field_2;
    local_88._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_168._M_dataplus._M_p,
               local_168._M_dataplus._M_p + local_168._M_string_length);
    iType(&local_148,&local_88,line);
    std::__cxx11::string::operator=((string *)&local_188,(string *)&local_148);
    _Var3._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
      _Var3._M_p = local_88._M_dataplus._M_p;
    }
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_128,local_128 + local_120);
    iVar2 = AsmFuncts::getType(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (iVar2 == 1) {
      paVar4 = &local_c8.field_2;
      local_c8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_168._M_dataplus._M_p,
                 local_168._M_dataplus._M_p + local_168._M_string_length);
      rType(&local_148,&local_c8);
      std::__cxx11::string::operator=((string *)&local_188,(string *)&local_148);
      _Var3._M_p = local_c8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
        _Var3._M_p = local_c8._M_dataplus._M_p;
      }
    }
    else {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_128,local_128 + local_120)
      ;
      iVar2 = AsmFuncts::getType(&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (iVar2 != 3) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        goto LAB_00128db1;
      }
      paVar4 = &local_108.field_2;
      local_108._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_168._M_dataplus._M_p,
                 local_168._M_dataplus._M_p + local_168._M_string_length);
      jType(&local_148,&local_108);
      std::__cxx11::string::operator=((string *)&local_188,(string *)&local_148);
      _Var3._M_p = local_108._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
        _Var3._M_p = local_108._M_dataplus._M_p;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_188 == &local_178) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_177,local_178);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_170;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_188;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_177,local_178);
  }
  __return_storage_ptr__->_M_string_length = local_180;
  local_180 = 0;
  local_178 = '\0';
  local_188 = &local_178;
LAB_00128db1:
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::procObj(string hex, int line){
    string bin = Conversion::hexToBin(hex);
    string aux = bin.substr(0,6);
    string resp;
    if(AsmFuncts::getType(aux) == TYPE_I){
        resp = iType(bin, line);
        return resp;
    }
    if(AsmFuncts::getType(aux) == TYPE_R){
        resp = rType(bin);
        return resp;
    }
    if(AsmFuncts::getType(aux) == TYPE_J){
        resp = jType(bin);
        return resp;
    }
    return "";
}